

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinePropertyCommand.h
# Opt level: O1

void __thiscall cmDefinePropertyCommand::~cmDefinePropertyCommand(cmDefinePropertyCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmDefinePropertyCommand_005ca448;
  pcVar2 = (this->FullDocs)._M_dataplus._M_p;
  paVar1 = &(this->FullDocs).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->BriefDocs)._M_dataplus._M_p;
  paVar1 = &(this->BriefDocs).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->PropertyName)._M_dataplus._M_p;
  paVar1 = &(this->PropertyName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  cmCommand::~cmCommand(&this->super_cmCommand);
  operator_delete(this,0xb0);
  return;
}

Assistant:

virtual cmCommand* Clone()
    {
      return new cmDefinePropertyCommand;
    }